

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O2

bool aux_positioning_horizontal(Board *board,int row,int col,Ship ship)

{
  bool bVar1;
  uint uVar2;
  int j;
  uint uVar3;
  
  if (ship.orientation != 'H') {
    return true;
  }
  if (ship.direction == -1) {
    for (uVar2 = row - 1; (int)uVar2 <= row + 1; uVar2 = uVar2 + 1) {
      for (uVar3 = col + 1; col - ship.length <= (int)uVar3; uVar3 = uVar3 - 1) {
        if ((((-1 < (int)uVar2) && (-1 < (int)uVar3)) && ((int)uVar2 < board->row)) &&
           (((int)uVar3 < board->column &&
            (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((ulong)uVar3 * 0x20 +
                                        *(long *)&(board->matrix).
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar2].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data),"~"), bVar1))))
        {
          return false;
        }
      }
    }
  }
  else {
    if (ship.direction != 1) {
      return true;
    }
    for (uVar2 = row - 1; (int)uVar2 <= row + 1; uVar2 = uVar2 + 1) {
      for (uVar3 = col - 1; (int)uVar3 <= col + ship.length; uVar3 = uVar3 + 1) {
        if (((-1 < (int)uVar2) && (-1 < (int)uVar3)) &&
           (((int)uVar2 < board->row &&
            (((int)uVar3 < board->column &&
             (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((ulong)uVar3 * 0x20 +
                                         *(long *)&(board->matrix).
                                                                                                      
                                                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar2].
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data),"~"), bVar1)))))
           ) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool aux_positioning_horizontal( Board *board, int row, int col, Ship ship )
{
    if( ship.orientation == 'H' )
    {
        if( ship.direction == 1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col - 1; j <= col + ship.length; j++ )
                {

                    if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                    {
                        continue;
                    }

                    if( board->matrix[i][j] != "~" )
                    {
                        return false;
                    }
                }
            }
        }
        else if( ship.direction == -1 )
        {
            for( int i = row - 1; i <= row + 1; i++ )
            {
                for( int j = col + 1; j >= col - ship.length; j-- )
                {
                  if( i < 0 or i > board->row - 1 or j < 0 or j > board->column - 1 )
                  {
                      continue;
                  }

                  if( board->matrix[i][j] != "~" )
                  {
                      return false;
                  }
                }
            }
        }
    }

    return true;
}